

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

bool __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::increase_size(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  ulong numBuckets;
  ulong uVar4;
  
  sVar3 = this->mMask;
  if (sVar3 == 0) {
    initData(this,8);
  }
  else {
    numBuckets = sVar3 + 1;
    if (numBuckets < 0x28f5c28f5c28f5d) {
      uVar2 = (numBuckets * 0x50) / 100;
    }
    else {
      uVar2 = (numBuckets / 100) * 0x50;
    }
    uVar4 = this->mNumElements;
    if (uVar4 < uVar2) {
      bVar1 = try_increase_info(this);
      if (bVar1) {
        return true;
      }
      sVar3 = this->mMask;
      uVar4 = this->mNumElements;
      numBuckets = sVar3 + 1;
    }
    if (numBuckets < 0x28f5c28f5c28f5d) {
      uVar2 = (numBuckets * 0x50) / 100;
    }
    else {
      uVar2 = (numBuckets / 100) * 0x50;
    }
    bVar1 = uVar2 <= uVar4 * 2;
    if (bVar1) {
      numBuckets = sVar3 * 2 + 2;
    }
    else {
      this->mHashMultiplier = this->mHashMultiplier + 0xc4ceb9fe1a85ec54;
    }
    rehashPowerOfTwo(this,numBuckets,!bVar1);
  }
  return true;
}

Assistant:

bool increase_size() {
        // nothing allocated yet? just allocate InitialNumElements
        if (0 == mMask) {
            initData(InitialNumElements);
            return true;
        }

        auto const maxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        if (mNumElements < maxNumElementsAllowed && try_increase_info()) {
            return true;
        }

        ROBIN_HOOD_LOG("mNumElements=" << mNumElements << ", maxNumElementsAllowed="
                                       << maxNumElementsAllowed << ", load="
                                       << (static_cast<double>(mNumElements) * 100.0 /
                                           (static_cast<double>(mMask) + 1)))

        if (mNumElements * 2 < calcMaxNumElementsAllowed(mMask + 1)) {
            // we have to resize, even though there would still be plenty of space left!
            // Try to rehash instead. Delete freed memory so we don't steadyily increase mem in case
            // we have to rehash a few times
            nextHashMultiplier();
            rehashPowerOfTwo(mMask + 1, true);
        } else {
            // we've reached the capacity of the map, so the hash seems to work nice. Keep using it.
            rehashPowerOfTwo((mMask + 1) * 2, false);
        }
        return true;
    }